

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

void __thiscall r_exec::Group::inject_reduction_jobs(Group *this,View *view)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  char cVar3;
  _Hash_node_base *p_Var4;
  __node_base *p_Var5;
  __node_base *p_Var6;
  bool bVar7;
  float fVar8;
  float fVar9;
  
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,7);
  fVar8 = (float)r_code::Atom::asFloat();
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[5])(this,8);
  fVar9 = (float)r_code::Atom::asFloat();
  if (fVar9 < fVar8) {
    p_Var6 = &(this->ipgm_views)._M_h._M_before_begin;
    cVar3 = '\0';
LAB_0016f61f:
    p_Var6 = p_Var6->_M_nxt;
    bVar7 = p_Var6 != (__node_base *)0x0;
    if (!bVar7) {
      bVar7 = false;
      p_Var5 = p_Var6;
      do {
        p_Var6 = (this->anti_ipgm_views)._M_h._M_before_begin._M_nxt;
        if ((cVar3 != '\0') && (p_Var6 = p_Var5, cVar3 == '\x01')) {
          cVar3 = '\0';
          break;
        }
        cVar3 = cVar3 + '\x01';
        bVar7 = p_Var6 != (__node_base *)0x0;
        p_Var5 = p_Var6;
      } while (p_Var6 == (__node_base *)0x0);
    }
    if (bVar7) {
      fVar8 = r_exec::View::get_act((View *)*(_Hash_node_base **)(p_Var6 + 2));
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,3);
      fVar9 = (float)r_code::Atom::asFloat();
      if (fVar9 < fVar8) {
        Controller::_take_input((Controller *)(*(_Hash_node_base **)(p_Var6 + 2))[0x16]._M_nxt,view)
        ;
      }
      goto LAB_0016f61f;
    }
  }
  p_Var1 = (this->viewing_groups)._M_h._M_before_begin._M_nxt;
  do {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      return;
    }
    if ((*(char *)&p_Var1[2]._M_nxt == '\0') &&
       (iVar2 = (*(view->super_View).super__Object._vptr__Object[2])(view), (char)iVar2 == '\0')) {
      p_Var4 = p_Var1[1]._M_nxt + 0x4e;
      cVar3 = '\0';
LAB_0016f6de:
      p_Var4 = p_Var4->_M_nxt;
      bVar7 = p_Var4 != (_Hash_node_base *)0x0;
      if (!bVar7) {
        bVar7 = false;
        do {
          if (cVar3 == '\0') {
            p_Var4 = p_Var1[1]._M_nxt[0x55]._M_nxt;
          }
          else if (cVar3 == '\x01') {
            cVar3 = '\0';
            break;
          }
          cVar3 = cVar3 + '\x01';
          bVar7 = p_Var4 != (_Hash_node_base *)0x0;
        } while (p_Var4 == (_Hash_node_base *)0x0);
      }
      if (bVar7) {
        fVar8 = r_exec::View::get_act((View *)p_Var4[2]._M_nxt);
        (*(code *)(p_Var1[1]._M_nxt)->_M_nxt[5]._M_nxt)(p_Var1[1]._M_nxt,3);
        fVar9 = (float)r_code::Atom::asFloat();
        if (fVar9 < fVar8) {
          Controller::_take_input((Controller *)p_Var4[2]._M_nxt[0x16]._M_nxt,view);
        }
        goto LAB_0016f6de;
      }
    }
    p_Var1 = p_Var1->_M_nxt;
  } while( true );
}

Assistant:

void Group::inject_reduction_jobs(View *view)
{
    if (get_c_act() > get_c_act_thr()) { // host is c-active.
        // build reduction jobs from host's own inputs and own overlays.
        FOR_ALL_VIEWS_WITH_INPUTS_BEGIN(this, v)

        if (v->second->get_act() > get_act_thr()) { //{ // active ipgm/icpp_pgm/rgrp view.
            v->second->controller->_take_input(view);    // view will be copied.
        }

        //std::cout<<std::hex<<(void *)v->second->controller<<std::dec<<" <- "<<view->object->get_oid()<<std::endl;}
        FOR_ALL_VIEWS_WITH_INPUTS_END
    }

    // build reduction jobs from host's own inputs and overlays from viewing groups, if no cov and view is not a notification.
    // NB: visibility is not transitive;
    // no shadowing: if a view alresady exists in the viewing group, there will be twice the reductions: all of the identicals will be trimmed down at injection time.
    std::unordered_map<Group *, bool>::const_iterator vg;

    for (vg = viewing_groups.begin(); vg != viewing_groups.end(); ++vg) {
        if (vg->second || view->isNotification()) { // no reduction jobs when cov==true or view is a notification.
            continue;
        }

        FOR_ALL_VIEWS_WITH_INPUTS_BEGIN(vg->first, v)

        if (v->second->get_act() > vg->first->get_act_thr()) { // active ipgm/icpp_pgm/rgrp view.
            v->second->controller->_take_input(view);    // view will be copied.
        }

        FOR_ALL_VIEWS_WITH_INPUTS_END
    }
}